

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void av1_fwd_txfm2d_16x8_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  byte in_CL;
  int lr_flip;
  int ud_flip;
  int8_t bit;
  transform_1d_avx2_conflict2 row_txfm;
  transform_1d_avx2_conflict2 col_txfm;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i out [16];
  __m256i in [16];
  int in_stack_fffffffffffffb64;
  int in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  int iVar1;
  int local_488;
  int8_t local_481;
  transform_1d_avx2_conflict2 local_480;
  transform_1d_avx2_conflict2 local_478;
  int local_470;
  int local_46c;
  int8_t *piVar2;
  int stride_00;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  __m256i *in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffc74;
  int in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  __m256i *in_stack_fffffffffffffc80;
  __m256i *in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  __m256i *in_stack_fffffffffffffca8;
  __m256i *in_stack_fffffffffffffcb0;
  longlong local_260 [67];
  byte local_45;
  
  piVar2 = av1_fwd_txfm_shift_ls[8];
  local_45 = in_CL;
  local_46c = get_txw_idx('\b');
  stride_00 = (int)((ulong)piVar2 >> 0x20);
  local_470 = get_txh_idx('\b');
  local_478 = col_highbd_txfm8x8_arr[local_45];
  local_480 = row_highbd_txfm8x16_arr[local_45];
  local_481 = av1_fwd_cos_bit_col[local_46c][local_470];
  get_flip_cfg(local_45,&local_488,(int *)&stack0xfffffffffffffb74);
  iVar1 = in_stack_fffffffffffffb74;
  load_buffer_16xn_avx2
            ((int16_t *)in[0xb][0],(__m256i *)in[10][3],in[10][2]._4_4_,(int)in[10][2],
             in[10][1]._4_4_,(int)in[10][1],in_stack_fffffffffffffb68);
  round_shift_32_8xn_avx2
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,stride_00
            );
  (*local_478)((__m256i *)local_260,(__m256i *)&stack0xfffffffffffffba0,local_481,2,2);
  round_shift_32_8xn_avx2
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,in_stack_fffffffffffffba0,stride_00
            );
  fwd_txfm_transpose_8x8_avx2
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
             in_stack_fffffffffffffca0);
  fwd_txfm_transpose_8x8_avx2
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
             in_stack_fffffffffffffca0);
  (*local_480)((__m256i *)local_260,(__m256i *)&stack0xfffffffffffffba0,local_481,1,1);
  round_shift_rect_array_32_avx2
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,
             in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
  store_buffer_avx2((__m256i *)CONCAT44(iVar1,in_stack_fffffffffffffb70),
                    (int32_t *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                    in_stack_fffffffffffffb64,in_stack_fffffffffffffb74);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x8_avx2(const int16_t *input, int32_t *coeff, int stride,
                              TX_TYPE tx_type, int bd) {
  __m256i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const transform_1d_avx2 col_txfm = col_highbd_txfm8x8_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  const int8_t bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_16xn_avx2(input, in, stride, 8, 2, ud_flip, lr_flip);
  round_shift_32_8xn_avx2(in, 16, shift[0], 1);
  col_txfm(in, out, bit, 2, 2);
  round_shift_32_8xn_avx2(out, 16, shift[1], 1);
  fwd_txfm_transpose_8x8_avx2(out, in, 2, 1);
  fwd_txfm_transpose_8x8_avx2(&out[1], &in[8], 2, 1);
  row_txfm(in, out, bit, 1, 1);
  round_shift_rect_array_32_avx2(out, out, 16, -shift[2], NewSqrt2);
  store_buffer_avx2(out, coeff, 8, 16);
  (void)bd;
}